

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

void __thiscall QTreeView::selectAll(QTreeView *this)

{
  SelectionMode SVar1;
  int iVar2;
  QTreeViewPrivate *this_00;
  long lVar3;
  QTreeViewItem *pQVar4;
  QAbstractItemModel *pQVar5;
  QAbstractItemModel *pQVar6;
  int iVar7;
  QItemSelectionModel *pQVar8;
  QTreeViewItem *in_R8;
  QTreeViewItem *pQVar9;
  timeval *in_R9;
  long in_FS_OFFSET;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  QAbstractItemModel *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  pQVar8 = QAbstractItemView::selectionModel((QAbstractItemView *)this);
  if (pQVar8 != (QItemSelectionModel *)0x0) {
    SVar1 = (this_00->super_QAbstractItemViewPrivate).selectionMode;
    if (((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
       ((this_00->super_QAbstractItemViewPrivate).state != CollapsingState)) {
      QAbstractItemViewPrivate::interruptDelayedItemsLayout
                (&this_00->super_QAbstractItemViewPrivate);
      (**(code **)(**(long **)&(this_00->super_QAbstractItemViewPrivate).
                               super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                               super_QWidgetPrivate.field_0x8 + 0x220))();
    }
    if ((SingleSelection < SVar1) && (lVar3 = (this_00->viewItems).d.size, lVar3 != 0)) {
      pQVar4 = (this_00->viewItems).d.ptr;
      pQVar9 = pQVar4 + lVar3 + -1;
      local_38 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      iVar2 = (pQVar9->index).r;
      pQVar5 = (this_00->super_QAbstractItemViewPrivate).model;
      pQVar6 = pQVar4[lVar3 + -1].index.m.ptr;
      if (pQVar6 == (QAbstractItemModel *)0x0) {
        local_60 = 0xffffffffffffffff;
        local_58 = 0;
        uStack_50 = 0;
      }
      else {
        (**(code **)(*(long *)pQVar6 + 0x68))(&local_60,pQVar6,pQVar9);
      }
      iVar7 = (**(code **)(*(long *)pQVar5 + 0x80))(pQVar5,&local_60);
      pQVar5 = pQVar4[lVar3 + -1].index.m.ptr;
      if (pQVar5 == (QAbstractItemModel *)0x0) {
        local_48 = (undefined1 *)0xffffffffffffffff;
        puStack_40 = (undefined1 *)0x0;
        local_38 = (QAbstractItemModel *)0x0;
      }
      else if ((pQVar4[lVar3 + -1].index.r == iVar2) && (pQVar4[lVar3 + -1].index.c == iVar7 + -1))
      {
        local_38 = pQVar4[lVar3 + -1].index.m.ptr;
        local_48 = *(undefined1 **)&pQVar9->index;
        puStack_40 = (undefined1 *)pQVar4[lVar3 + -1].index.i;
      }
      else {
        in_R9 = *(timeval **)pQVar5;
        (*(code *)in_R9[7].tv_sec)(&stack0xffffffffffffffb8,pQVar5,iVar2,iVar7 + -1);
        in_R8 = pQVar9;
      }
      QTreeViewPrivate::select
                (this_00,(int)(this_00->viewItems).d.ptr,(fd_set *)&stack0xffffffffffffffb8,
                 (fd_set *)0x23,(fd_set *)in_R8,in_R9);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::selectAll()
{
    Q_D(QTreeView);
    if (!selectionModel())
        return;
    SelectionMode mode = d->selectionMode;
    d->executePostedLayout(); //make sure we lay out the items
    if (mode != SingleSelection && mode != NoSelection && !d->viewItems.isEmpty()) {
        const QModelIndex &idx = d->viewItems.constLast().index;
        QModelIndex lastItemIndex = idx.sibling(idx.row(), d->model->columnCount(idx.parent()) - 1);
        d->select(d->viewItems.constFirst().index, lastItemIndex,
                  QItemSelectionModel::ClearAndSelect
                  |QItemSelectionModel::Rows);
    }
}